

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O0

Matrix33 *
AML::eulerAngleRatesMatrix_XYZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_98;
  double data [3] [3];
  double secTheta;
  double tanTheta;
  double cosTheta;
  double sinPhi;
  double cosPhi;
  double psi_local;
  double theta_local;
  double phi_local;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = tan(theta);
  local_98 = 1.0;
  data[0][0] = dVar2 * dVar4;
  data[0][1] = dVar1 * dVar4;
  data[0][2] = 0.0;
  data[1][1] = -dVar2;
  data[1][2] = 0.0;
  data[2][0] = dVar2 * (1.0 / dVar3);
  data[2][1] = dVar1 * (1.0 / dVar3);
  data[1][0] = dVar1;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_98);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_XYZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double tanTheta = tan(theta);
        const double secTheta = 1.0 / cosTheta;

        double data[3][3] = { { 1.0, sinPhi * tanTheta, cosPhi * tanTheta },
                              { 0.0, cosPhi, -sinPhi },
                              { 0.0, sinPhi * secTheta, cosPhi * secTheta } };

        return Matrix33(data);
    }